

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O2

int __thiscall CCommandManager::RemoveCommand(CCommandManager *this,char *pCommand)

{
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  lVar2 = 0;
  do {
    lVar3 = (long)(this->m_aCommands).num_elements;
    if (lVar3 <= lVar2) {
LAB_00131344:
      return (int)(lVar3 <= lVar2);
    }
    iVar1 = str_comp(((this->m_aCommands).list)->m_aName + lVar4,pCommand);
    if (iVar1 == 0) {
      if (this->m_pfnRemoveCommandHook != (FRemoveCommandHook)0x0) {
        (*this->m_pfnRemoveCommandHook)
                  ((CCommand *)(((this->m_aCommands).list)->m_aName + lVar4),this->m_pHookContext);
      }
      array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::remove_index
                (&this->m_aCommands,(int)lVar2);
      goto LAB_00131344;
    }
    lVar2 = lVar2 + 1;
    lVar4 = lVar4 + 0xa0;
  } while( true );
}

Assistant:

int RemoveCommand(const char *pCommand)
    {
        for(int i = 0; i < m_aCommands.size(); i++)
        {
            if(!str_comp(m_aCommands[i].m_aName, pCommand))
            {
                if(m_pfnRemoveCommandHook)
                    m_pfnRemoveCommandHook(&m_aCommands[i], m_pHookContext);

                m_aCommands.remove_index(i);
                return 0;
            }
        }

        return 1;
    }